

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cComputeShaderTests.cpp
# Opt level: O3

long __thiscall gl4cts::anon_unknown_0::AdvancedPipelinePostFS::Run(AdvancedPipelinePostFS *this)

{
  CallLogWrapper *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  ulong uVar4;
  bool bVar5;
  GLuint GVar6;
  undefined4 extraout_EAX;
  int iVar7;
  void *__s;
  float *__s_00;
  float *pfVar8;
  uint uVar9;
  ulong uVar10;
  bool *compile_error;
  bool *compile_error_00;
  bool *compile_error_01;
  bool bVar11;
  ulong uVar12;
  long lVar13;
  string local_70;
  string local_50;
  
  paVar1 = &local_70.field_2;
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_70,
             "\nconst vec2 g_vertex[4] = vec2[4](vec2(0), vec2(-1, -1), vec2(3, -1), vec2(-1, 3));\nvoid main() {\n  gl_Position = vec4(g_vertex[gl_VertexID], 0, 1);\n}"
             ,"");
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,
             "\nlayout(location = 0) out vec4 g_color;\nvoid main() {\n  g_color = vec4(1, 0, 0, 1);\n}"
             ,"");
  GVar6 = ComputeShaderBase::CreateProgram(&this->super_ComputeShaderBase,&local_70,&local_50);
  this->m_program[0] = GVar6;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  this_00 = &(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper;
  glu::CallLogWrapper::glLinkProgram(this_00,this->m_program[0]);
  bVar5 = ComputeShaderBase::CheckProgram
                    (&this->super_ComputeShaderBase,this->m_program[0],compile_error);
  lVar13 = -1;
  if (bVar5) {
    local_70._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_70,
               "\n#define TILE_WIDTH 16\n#define TILE_HEIGHT 16\nconst ivec2 kTileSize = ivec2(TILE_WIDTH, TILE_HEIGHT);\n\nlayout(binding = 0, rgba32f) uniform image2D g_input_image;\nlayout(binding = 1, rgba32f) uniform image2D g_output_image;\n\nlayout(local_size_x = TILE_WIDTH, local_size_y=TILE_HEIGHT) in;\n\nvoid main() {\n  const ivec2 tile_xy = ivec2(gl_WorkGroupID);\n  const ivec2 thread_xy = ivec2(gl_LocalInvocationID);\n\n  if (thread_xy == ivec2(0)) {\n    const ivec2 pixel_xy = tile_xy * kTileSize;\n    for (int y = 0; y < TILE_HEIGHT; ++y) {\n      for (int x = 0; x < TILE_WIDTH; ++x) {\n        imageStore(g_output_image, pixel_xy + ivec2(x, y), vec4(0, 1, 0, 1));\n      }\n    }\n  }\n}"
               ,"");
    GVar6 = ComputeShaderBase::CreateComputeProgram(&this->super_ComputeShaderBase,&local_70);
    this->m_program[1] = GVar6;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != paVar1) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      GVar6 = this->m_program[1];
    }
    glu::CallLogWrapper::glLinkProgram(this_00,GVar6);
    bVar5 = ComputeShaderBase::CheckProgram
                      (&this->super_ComputeShaderBase,this->m_program[1],compile_error_00);
    if (bVar5) {
      local_70._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_70,
                 "\n#define TILE_WIDTH 32\n#define TILE_HEIGHT 32\nconst ivec2 kTileSize = ivec2(TILE_WIDTH, TILE_HEIGHT);\n\nlayout(binding = 0, rgba32f) uniform image2D g_input_image;\nlayout(binding = 1, rgba32f) uniform image2D g_output_image;\n\nlayout(local_size_x = TILE_WIDTH, local_size_y=TILE_HEIGHT) in;\n\nvec4 Process(vec4 ic) {\n  return ic + vec4(1, 0, 0, 0);\n}\nvoid main() {\n  const ivec2 tile_xy = ivec2(gl_WorkGroupID);\n  const ivec2 thread_xy = ivec2(gl_LocalInvocationID);\n  const ivec2 pixel_xy = tile_xy * kTileSize + thread_xy;\n  vec4 ic = imageLoad(g_input_image, pixel_xy);\n  imageStore(g_output_image, pixel_xy, Process(ic));\n}"
                 ,"");
      GVar6 = ComputeShaderBase::CreateComputeProgram(&this->super_ComputeShaderBase,&local_70);
      this->m_program[2] = GVar6;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != paVar1) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
        GVar6 = this->m_program[2];
      }
      glu::CallLogWrapper::glLinkProgram(this_00,GVar6);
      bVar5 = ComputeShaderBase::CheckProgram
                        (&this->super_ComputeShaderBase,this->m_program[2],compile_error_01);
      if (bVar5) {
        glu::CallLogWrapper::glGenVertexArrays(this_00,1,&this->m_vertex_array);
        __s = operator_new(0x40000);
        memset(__s,0,0x40000);
        glu::CallLogWrapper::glGenTextures(this_00,2,this->m_render_target);
        lVar13 = 0;
        bVar5 = true;
        do {
          bVar11 = bVar5;
          glu::CallLogWrapper::glBindTexture(this_00,0xde1,this->m_render_target[lVar13]);
          glu::CallLogWrapper::glTexParameteri(this_00,0xde1,0x2801,0x2601);
          glu::CallLogWrapper::glTexImage2D(this_00,0xde1,0,0x8814,0x80,0x80,0,0x1908,0x1406,__s);
          lVar13 = 1;
          bVar5 = false;
        } while (bVar11);
        glu::CallLogWrapper::glBindTexture(this_00,0xde1,0);
        operator_delete(__s,0x40000);
        glu::CallLogWrapper::glGenFramebuffers(this_00,1,&this->m_framebuffer);
        glu::CallLogWrapper::glBindFramebuffer(this_00,0x8d40,this->m_framebuffer);
        glu::CallLogWrapper::glFramebufferTexture(this_00,0x8d40,0x8ce0,this->m_render_target[0],0);
        glu::CallLogWrapper::glBindFramebuffer(this_00,0x8d40,0);
        glu::CallLogWrapper::glBindFramebuffer(this_00,0x8d40,this->m_framebuffer);
        glu::CallLogWrapper::glUseProgram(this_00,this->m_program[0]);
        glu::CallLogWrapper::glBindVertexArray(this_00,this->m_vertex_array);
        glu::CallLogWrapper::glClear(this_00,0x4000);
        glu::CallLogWrapper::glViewport(this_00,0,0,0x80,0x80);
        glu::CallLogWrapper::glDrawArrays(this_00,4,1,3);
        glu::CallLogWrapper::glBindFramebuffer(this_00,0x8d40,0);
        glu::CallLogWrapper::glBindImageTexture
                  (this_00,0,this->m_render_target[0],0,'\0',0,35000,0x8814);
        glu::CallLogWrapper::glBindImageTexture
                  (this_00,1,this->m_render_target[1],0,'\0',0,0x88b9,0x8814);
        glu::CallLogWrapper::glUseProgram(this_00,this->m_program[1]);
        glu::CallLogWrapper::glDispatchCompute(this_00,8,8,1);
        glu::CallLogWrapper::glBindImageTexture
                  (this_00,0,this->m_render_target[1],0,'\0',0,35000,0x8814);
        glu::CallLogWrapper::glBindImageTexture
                  (this_00,1,this->m_render_target[0],0,'\0',0,0x88b9,0x8814);
        glu::CallLogWrapper::glUseProgram(this_00,this->m_program[2]);
        glu::CallLogWrapper::glMemoryBarrier(this_00,0x20);
        glu::CallLogWrapper::glDispatchCompute(this_00,4,4,1);
        __s_00 = (float *)operator_new(0x40000);
        memset(__s_00,0,0x40000);
        glu::CallLogWrapper::glBindTexture(this_00,0xde1,this->m_render_target[0]);
        glu::CallLogWrapper::glMemoryBarrier(this_00,0x100);
        uVar10 = 0x1908;
        glu::CallLogWrapper::glGetTexImage(this_00,0xde1,0,0x1908,0x1406,__s_00);
        auVar2._4_4_ = -(uint)(__s_00[1] != 1.0);
        auVar2._0_4_ = -(uint)(*__s_00 != 1.0);
        auVar2._8_4_ = -(uint)(__s_00[2] != 0.0);
        auVar2._12_4_ = -(uint)(__s_00[3] != 1.0);
        iVar7 = movmskps(extraout_EAX,auVar2);
        if (iVar7 == 0) {
          uVar4 = 0xffffffffffffffff;
          pfVar8 = __s_00;
          do {
            uVar12 = uVar4;
            if (uVar12 == 0x3ffe) {
              bVar5 = false;
              goto LAB_009150a8;
            }
            auVar3._4_4_ = -(uint)(pfVar8[5] != 1.0);
            auVar3._0_4_ = -(uint)(pfVar8[4] != 1.0);
            auVar3._8_4_ = -(uint)(pfVar8[6] != 0.0);
            auVar3._12_4_ = -(uint)(pfVar8[7] != 1.0);
            uVar9 = movmskps((int)uVar10,auVar3);
            uVar10 = (ulong)uVar9;
            uVar4 = uVar12 + 1;
            pfVar8 = pfVar8 + 4;
          } while (uVar9 == 0);
          bVar5 = uVar12 + 1 < 0x3fff;
          lVar13 = uVar12 + 2;
        }
        else {
          bVar5 = true;
          lVar13 = 0;
        }
        anon_unknown_0::Output("Invalid data at index %d.\n",lVar13);
LAB_009150a8:
        operator_delete(__s_00,0x40000);
        lVar13 = -(ulong)bVar5;
      }
    }
  }
  return lVar13;
}

Assistant:

virtual long Run()
	{
		const char* const glsl_vs =
			NL "const vec2 g_vertex[4] = vec2[4](vec2(0), vec2(-1, -1), vec2(3, -1), vec2(-1, 3));" NL
			   "void main() {" NL "  gl_Position = vec4(g_vertex[gl_VertexID], 0, 1);" NL "}";

		const char* const glsl_fs =
			NL "layout(location = 0) out vec4 g_color;" NL "void main() {" NL "  g_color = vec4(1, 0, 0, 1);" NL "}";

		m_program[0] = CreateProgram(glsl_vs, glsl_fs);
		glLinkProgram(m_program[0]);
		if (!CheckProgram(m_program[0]))
			return ERROR;

		const char* const glsl_cs =
			NL "#define TILE_WIDTH 16" NL "#define TILE_HEIGHT 16" NL
			   "const ivec2 kTileSize = ivec2(TILE_WIDTH, TILE_HEIGHT);" NL NL
			   "layout(binding = 0, rgba32f) uniform image2D g_input_image;" NL
			   "layout(binding = 1, rgba32f) uniform image2D g_output_image;" NL	NL
			   "layout(local_size_x = TILE_WIDTH, local_size_y=TILE_HEIGHT) in;" NL NL "void main() {" NL
			   "  const ivec2 tile_xy = ivec2(gl_WorkGroupID);" NL
			   "  const ivec2 thread_xy = ivec2(gl_LocalInvocationID);" NL NL "  if (thread_xy == ivec2(0)) {" NL
			   "    const ivec2 pixel_xy = tile_xy * kTileSize;" NL "    for (int y = 0; y < TILE_HEIGHT; ++y) {" NL
			   "      for (int x = 0; x < TILE_WIDTH; ++x) {" NL
			   "        imageStore(g_output_image, pixel_xy + ivec2(x, y), vec4(0, 1, 0, 1));" NL "      }" NL
			   "    }" NL "  }" NL "}";

		m_program[1] = CreateComputeProgram(glsl_cs);
		glLinkProgram(m_program[1]);
		if (!CheckProgram(m_program[1]))
			return ERROR;

		const char* const glsl_cs2 = NL "#define TILE_WIDTH 32" NL "#define TILE_HEIGHT 32" NL
										"const ivec2 kTileSize = ivec2(TILE_WIDTH, TILE_HEIGHT);" NL NL
										"layout(binding = 0, rgba32f) uniform image2D g_input_image;" NL
										"layout(binding = 1, rgba32f) uniform image2D g_output_image;" NL	NL
										"layout(local_size_x = TILE_WIDTH, local_size_y=TILE_HEIGHT) in;" NL NL
										"vec4 Process(vec4 ic) {" NL "  return ic + vec4(1, 0, 0, 0);" NL "}" NL
										"void main() {" NL "  const ivec2 tile_xy = ivec2(gl_WorkGroupID);" NL
										"  const ivec2 thread_xy = ivec2(gl_LocalInvocationID);" NL
										"  const ivec2 pixel_xy = tile_xy * kTileSize + thread_xy;" NL
										"  vec4 ic = imageLoad(g_input_image, pixel_xy);" NL
										"  imageStore(g_output_image, pixel_xy, Process(ic));" NL "}";
		m_program[2] = CreateComputeProgram(glsl_cs2);
		glLinkProgram(m_program[2]);
		if (!CheckProgram(m_program[2]))
			return ERROR;

		glGenVertexArrays(1, &m_vertex_array);

		/* init render targets */
		{
			std::vector<vec4> data(128 * 128);
			glGenTextures(2, m_render_target);
			for (int i = 0; i < 2; ++i)
			{
				glBindTexture(GL_TEXTURE_2D, m_render_target[i]);
				glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_LINEAR);
				glTexImage2D(GL_TEXTURE_2D, 0, GL_RGBA32F, 128, 128, 0, GL_RGBA, GL_FLOAT, &data[0][0]);
			}
			glBindTexture(GL_TEXTURE_2D, 0);
		}

		glGenFramebuffers(1, &m_framebuffer);
		glBindFramebuffer(GL_FRAMEBUFFER, m_framebuffer);
		glFramebufferTexture(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, m_render_target[0], 0);
		glBindFramebuffer(GL_FRAMEBUFFER, 0);

		glBindFramebuffer(GL_FRAMEBUFFER, m_framebuffer);
		glUseProgram(m_program[0]);
		glBindVertexArray(m_vertex_array);
		glClear(GL_COLOR_BUFFER_BIT);
		glViewport(0, 0, 128, 128);
		// draw full-viewport triangle
		glDrawArrays(GL_TRIANGLES, 1,
					 3); // note: <first> is 1 this means that gl_VertexID in the VS will be: 1, 2 and 3
		glBindFramebuffer(GL_FRAMEBUFFER, 0);

		glBindImageTexture(0, m_render_target[0], 0, GL_FALSE, 0, GL_READ_ONLY, GL_RGBA32F);  // input
		glBindImageTexture(1, m_render_target[1], 0, GL_FALSE, 0, GL_WRITE_ONLY, GL_RGBA32F); // output
		glUseProgram(m_program[1]);
		glDispatchCompute(128 / 16, 128 / 16, 1);

		glBindImageTexture(0, m_render_target[1], 0, GL_FALSE, 0, GL_READ_ONLY, GL_RGBA32F);  // input
		glBindImageTexture(1, m_render_target[0], 0, GL_FALSE, 0, GL_WRITE_ONLY, GL_RGBA32F); // output
		glUseProgram(m_program[2]);
		glMemoryBarrier(GL_SHADER_IMAGE_ACCESS_BARRIER_BIT);
		glDispatchCompute(128 / 32, 128 / 32, 1);

		/* validate render target */
		{
			std::vector<vec4> data(128 * 128);
			glBindTexture(GL_TEXTURE_2D, m_render_target[0]);
			glMemoryBarrier(GL_TEXTURE_UPDATE_BARRIER_BIT);
			glGetTexImage(GL_TEXTURE_2D, 0, GL_RGBA, GL_FLOAT, &data[0][0]);
			for (std::size_t i = 0; i < data.size(); ++i)
			{
				if (!IsEqual(data[i], vec4(1, 1, 0, 1)))
				{
					Output("Invalid data at index %d.\n", i);
					return ERROR;
				}
			}
		}
		return NO_ERROR;
	}